

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::JavascriptArray::GetPropertyQuery
          (JavascriptArray *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  BOOL BVar1;
  uint32 local_4c;
  ScriptContext *pSStack_48;
  uint32 index;
  ScriptContext *scriptContext;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *value_local;
  Var pvStack_20;
  PropertyId propertyId_local;
  Var originalInstance_local;
  JavascriptArray *this_local;
  
  scriptContext = requestContext;
  requestContext_local = (ScriptContext *)info;
  info_local = (PropertyValueInfo *)value;
  value_local._4_4_ = propertyId;
  pvStack_20 = originalInstance;
  originalInstance_local = this;
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(this);
  BVar1 = GetPropertyBuiltIns(this,value_local._4_4_,&info_local->m_instance);
  if (BVar1 == 0) {
    pSStack_48 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    BVar1 = ScriptContext::IsNumericPropertyId(pSStack_48,value_local._4_4_,&local_4c);
    if (BVar1 == 0) {
      this_local._4_4_ =
           DynamicObject::GetPropertyQuery
                     ((DynamicObject *)this,pvStack_20,value_local._4_4_,&info_local->m_instance,
                      (PropertyValueInfo *)requestContext_local,scriptContext);
    }
    else {
      BVar1 = RecyclableObject::GetItem
                        ((RecyclableObject *)this,this,local_4c,&info_local->m_instance,pSStack_48);
      this_local._4_4_ = JavascriptConversion::BooleanToPropertyQueryFlags(BVar1);
    }
  }
  else {
    this_local._4_4_ = Property_Found;
  }
  return this_local._4_4_;
}

Assistant:

PropertyQueryFlags JavascriptArray::GetPropertyQuery(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        if (GetPropertyBuiltIns(propertyId, value))
        {
            return PropertyQueryFlags::Property_Found;
        }

        ScriptContext* scriptContext = GetScriptContext();
        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            return JavascriptConversion::BooleanToPropertyQueryFlags(this->GetItem(this, index, value, scriptContext));
        }

        return DynamicObject::GetPropertyQuery(originalInstance, propertyId, value, info, requestContext);
    }